

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O0

ssize_t __thiscall IniProcessing::read(IniProcessing *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer ppVar1;
  long lVar2;
  undefined1 *puVar3;
  undefined4 in_register_00000034;
  string *k;
  iterator e;
  bool ok;
  uchar defVal_local;
  uchar *dest_local;
  char *key_local;
  IniProcessing *this_local;
  
  e.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  ._M_cur._7_1_ = (undefined1)__nbytes;
  e.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  ._M_cur._6_1_ = 0;
  k = (string *)
      IniProcessing_readHelper_abi_cxx11_
                (this,(char *)CONCAT44(in_register_00000034,__fd),
                 (bool *)((long)&e.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 ._M_cur + 6));
  if ((e.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       ._M_cur._6_1_ & 1) == 0) {
    *(undefined1 *)__buf =
         e.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
         ._M_cur._7_1_;
  }
  else {
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                           *)&k);
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      *(undefined1 *)__buf =
           e.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
           ._M_cur._7_1_;
    }
    else {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&ppVar1->second);
      *(undefined1 *)__buf = *puVar3;
    }
  }
  return (ssize_t)__buf;
}

Assistant:

void IniProcessing::read(const char *key, unsigned char &dest, unsigned char defVal)
{
    bool ok = false;
    params::IniKeys::iterator e = IniProcessing_readHelper(this, key, ok);

    if(!ok)
    {
        dest = defVal;
        return;
    }

    std::string &k = e->second;

    if(k.size() >= 1)
        dest = static_cast<unsigned char>(k[0]);
    else
        dest = defVal;
}